

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_benchmark.cc
# Opt level: O0

void re2::Parse_CachedDigitDs_NFA(int i)

{
  int i_local;
  
  Parse3DigitDs(i,Parse3CachedNFA);
  return;
}

Assistant:

void Parse_CachedDigitDs_NFA(int i)         { Parse3DigitDs(i, Parse3CachedNFA); }